

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

void udata_setAppData_63(char *path,void *data,UErrorCode *err)

{
  UDataMemory udm;
  UDataMemory UStack_58;
  
  if (err != (UErrorCode *)0x0) {
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
      if (data == (void *)0x0) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        UDataMemory_init_63(&UStack_58);
        UDataMemory_setData_63(&UStack_58,data);
        udata_checkCommonData_63(&UStack_58,err);
        udata_cacheDataItem(path,&UStack_58,err);
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_setAppData(const char *path, const void *data, UErrorCode *err)
{
    UDataMemory     udm;

    if(err==NULL || U_FAILURE(*err)) {
        return;
    }
    if(data==NULL) {
        *err=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    UDataMemory_init(&udm);
    UDataMemory_setData(&udm, data);
    udata_checkCommonData(&udm, err);
    udata_cacheDataItem(path, &udm, err);
}